

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROCmActivityReportController.cpp
# Opt level: O0

bool anon_unknown.dwarf_4255eb::use_mpi(Options *opts)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  Log local_2b0;
  string local_a8;
  StringConverter local_88;
  byte local_61;
  iterator iStack_60;
  bool use_mpi;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  byte local_29;
  undefined1 local_28 [7];
  bool have_mpireport;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  services;
  Options *opts_local;
  
  services.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)opts;
  cali::services::get_available_services_abi_cxx11_();
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_28);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_28);
  local_38 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[10]>
                       (local_40,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_48,(char (*) [10])0x4958f0);
  iStack_60 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_28);
  local_61 = __gnu_cxx::operator!=(&local_38,&stack0xffffffffffffffa0);
  local_29 = local_61;
  bVar2 = cali::ConfigManager::Options::is_set
                    ((Options *)
                     services.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,"aggregate_across_ranks");
  if (bVar2) {
    cali::ConfigManager::Options::get_abi_cxx11_
              (&local_a8,
               (Options *)
               services.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,"aggregate_across_ranks","");
    cali::StringConverter::StringConverter(&local_88,&local_a8);
    local_61 = cali::StringConverter::to_bool(&local_88,(bool *)0x0);
    cali::StringConverter::~StringConverter(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if (((local_61 & 1) != 0) && ((local_29 & 1) == 0)) {
    local_61 = 0;
    cali::Log::Log(&local_2b0,0);
    poVar3 = cali::Log::stream(&local_2b0);
    poVar3 = std::operator<<(poVar3,
                             "sample-report: cannot enable mpi support: mpireport service is not available."
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    cali::Log::~Log(&local_2b0);
  }
  bVar1 = local_61;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return (bool)(bVar1 & 1);
}

Assistant:

bool use_mpi(const cali::ConfigManager::Options& opts)
{
    auto services = services::get_available_services();

    bool have_mpireport = std::find(services.begin(), services.end(), "mpireport") != services.end();

    bool use_mpi = have_mpireport;

    if (opts.is_set("aggregate_across_ranks"))
        use_mpi = StringConverter(opts.get("aggregate_across_ranks")).to_bool();

    if (use_mpi && !have_mpireport) {
        use_mpi = false;
        Log(0).stream() << "rocm-activity: cannot enable mpi support: mpireport service is not available." << std::endl;
    }

    return use_mpi;
}